

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSphericalHarmonic.cpp
# Opt level: O2

RealType __thiscall
OpenMD::RealSphericalHarmonic::LegendreP(RealSphericalHarmonic *this,int l,int m,RealType x)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  RealType RVar6;
  RealType RVar7;
  double dVar8;
  double dVar9;
  
  uVar2 = (ulong)(uint)m;
  if (((m < 0) || (l < m)) || (1.0 < ABS(x))) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n",x,l,uVar2);
    RVar7 = NAN;
  }
  else {
    dVar9 = 1.0;
    if (m != 0) {
      dVar5 = (x + 1.0) * (1.0 - x);
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar9 = 1.0;
      dVar8 = 1.0;
      while (iVar4 = (int)uVar2, uVar2 = (ulong)(iVar4 - 1), iVar4 != 0) {
        dVar9 = dVar9 * -dVar8 * dVar5;
        dVar8 = dVar8 + 2.0;
      }
    }
    RVar7 = dVar9;
    if ((l != m) && (RVar7 = (double)(m * 2 + 1) * x * dVar9, m + 1 != l)) {
      iVar1 = m * 2 + 3;
      iVar3 = m * 2;
      RVar6 = 0.0;
      for (iVar4 = 2; dVar5 = RVar7, iVar3 = iVar3 + 1, RVar7 = RVar6, m + iVar4 <= l;
          iVar4 = iVar4 + 1) {
        RVar6 = ((double)iVar1 * x * dVar5 - dVar9 * (double)iVar3) / (double)iVar4;
        iVar1 = iVar1 + 2;
        RVar7 = RVar6;
        dVar9 = dVar5;
      }
    }
  }
  return RVar7;
}

Assistant:

RealType RealSphericalHarmonic::LegendreP(int l, int m, RealType x) {
  // check parameters
  if (m < 0 || m > l || fabs(x) > 1.0) {
    printf("LegendreP got a bad argument: l = %d\tm = %d\tx = %lf\n", l, m, x);
    //    return NAN;
    return std::numeric_limits<RealType>::quiet_NaN();
  }

  RealType pmm = 1.0;
  if (m > 0) {
    RealType h = sqrt((1.0 - x) * (1.0 + x)), f = 1.0;
    for (int i = 1; i <= m; i++) {
      pmm *= -f * h;
      f += 2.0;
    }
  }
  if (l == m)
    return pmm;
  else {
    RealType pmmp1 = x * (2 * m + 1) * pmm;
    if (l == (m + 1))
      return pmmp1;
    else {
      RealType pll = 0.0;
      for (int ll = m + 2; ll <= l; ll++) {
        pll   = (x * (2 * ll - 1) * pmmp1 - (ll + m - 1) * pmm) / (ll - m);
        pmm   = pmmp1;
        pmmp1 = pll;
      }
      return pll;
    }
  }
}